

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O3

void __thiscall dd::ProcessThreadImpl::Start(ProcessThreadImpl *this)

{
  PlatformThread *pPVar1;
  bool bVar2;
  PlatformThread *this_00;
  _List_node_base *p_Var3;
  allocator<char> local_39;
  string local_38;
  
  bVar2 = SequenceCheckerImpl::IsCurrent((SequenceCheckerImpl *)&this->_thread_checker);
  if (!bVar2) {
    __assert_fail("_thread_checker.IsCurrent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                  ,0x2e,"virtual void dd::ProcessThreadImpl::Start()");
  }
  if ((this->_thread)._M_t.
      super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>._M_t.
      super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>.
      super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl == (PlatformThread *)0x0) {
    if (this->_stop != true) {
      for (p_Var3 = (this->_modules).
                    super__List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          p_Var3 != (_List_node_base *)&this->_modules; p_Var3 = p_Var3->_M_next) {
        (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x10))(p_Var3[1]._M_next,this);
      }
      this_00 = (PlatformThread *)operator_new(0xd8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,this->_thread_name,&local_39);
      PlatformThread::PlatformThread(this_00,Run,this,&local_38,kNormalPriority);
      pPVar1 = (this->_thread)._M_t.
               super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>.
               _M_t.
               super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>
               .super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl;
      (this->_thread)._M_t.
      super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>._M_t.
      super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>.
      super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl = this_00;
      if (pPVar1 != (PlatformThread *)0x0) {
        (*pPVar1->_vptr_PlatformThread[1])();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      PlatformThread::Start
                ((this->_thread)._M_t.
                 super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>
                 .super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl);
      return;
    }
    __assert_fail("!_stop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                  ,0x32,"virtual void dd::ProcessThreadImpl::Start()");
  }
  __assert_fail("!_thread.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                ,0x2f,"virtual void dd::ProcessThreadImpl::Start()");
}

Assistant:

void ProcessThreadImpl::Start() {
		assert(_thread_checker.IsCurrent());
		assert(!_thread.get());
		if (_thread.get())
			return;
		assert(!_stop);

		for (ModuleCallback& m : _modules)
			m.module->ProcessThreadAttached(this);

		_thread.reset(new PlatformThread(&ProcessThreadImpl::Run, this, _thread_name));
		_thread->Start();
	}